

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSVparser.cpp
# Opt level: O0

Row * __thiscall csv::Row::operator[][abi_cxx11_(Row *this,uint valuePosition)

{
  size_type sVar1;
  const_reference pvVar2;
  Error *this_00;
  uint in_EDX;
  undefined4 in_register_00000034;
  long lVar3;
  allocator local_41;
  string local_40 [36];
  uint local_1c;
  long lStack_18;
  uint valuePosition_local;
  Row *this_local;
  
  lVar3 = CONCAT44(in_register_00000034,valuePosition);
  local_1c = in_EDX;
  lStack_18 = lVar3;
  this_local = this;
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(lVar3 + 0x18));
  if (in_EDX < sVar1) {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(lVar3 + 0x18),(ulong)local_1c);
    std::__cxx11::string::string((string *)this,(string *)pvVar2);
    return this;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"can\'t return this value (doesn\'t exist)",&local_41);
  Error::Error(this_00,(string *)local_40);
  __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
}

Assistant:

const std::string Row::operator[](unsigned int valuePosition) const
  {
       if (valuePosition < _values.size())
           return _values[valuePosition];
       throw Error("can't return this value (doesn't exist)");
  }